

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

ptr<Member> __thiscall Environment::getMember(Environment *this,Identifier *ident)

{
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Member> pVar2;
  Identifier IStack_68;
  Symbol local_48;
  
  std::__cxx11::string::string((string *)&IStack_68,in_RDX);
  Symbol::Symbol(&local_48,&IStack_68);
  p_Var1 = &std::__detail::
            _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)ident,&local_48)->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var1);
  Symbol::~Symbol(&local_48);
  std::__cxx11::string::~string((string *)&IStack_68);
  pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Member>)pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Member> Environment::getMember(const Identifier &ident) {
    return symbols[ident];
}